

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ListBoxHeader(char *label,ImVec2 *size_arg)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiID id_00;
  ImGuiWindow *pIVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  float local_dc;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  undefined1 local_88 [8];
  ImRect bb;
  undefined1 local_70 [8];
  ImRect frame_bb;
  ImVec2 frame_size;
  float local_4c;
  float fStack_48;
  ImVec2 size;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *size_arg_local;
  char *label_local;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->SkipItems & 1U) == 0) {
    id_00 = GetID(label);
    IVar6 = CalcTextSize(label,(char *)0x0,true,-1.0);
    IVar7 = *size_arg;
    fVar4 = CalcItemWidth();
    fVar5 = GetTextLineHeightWithSpacing();
    IVar7 = CalcItemSize(IVar7,fVar4,fVar5 * 7.4 + (pIVar1->Style).ItemSpacing.y);
    local_4c = IVar7.x;
    fStack_48 = IVar7.y;
    size.y = IVar6.y;
    fVar4 = ImMax<float>(fStack_48,size.y);
    ImVec2::ImVec2(&frame_bb.Max,local_4c,fVar4);
    bb.Max = ::operator+(&(pIVar3->DC).CursorPos,&frame_bb.Max);
    ImRect::ImRect((ImRect *)local_70,&(pIVar3->DC).CursorPos,&bb.Max);
    size.x = IVar6.x;
    if (size.x <= 0.0) {
      local_dc = 0.0;
    }
    else {
      local_dc = (pIVar1->Style).ItemInnerSpacing.x + size.x;
    }
    ImVec2::ImVec2(&local_98,local_dc,0.0);
    local_90 = ::operator+(&frame_bb.Min,&local_98);
    ImRect::ImRect((ImRect *)local_88,(ImVec2 *)local_70,&local_90);
    (pIVar3->DC).LastItemRect.Min.x = (float)local_88._0_4_;
    (pIVar3->DC).LastItemRect.Min.y = (float)local_88._4_4_;
    (pIVar3->DC).LastItemRect.Max = bb.Min;
    ImGuiNextItemData::ClearFlags(&pIVar1->NextItemData);
    bVar2 = IsRectVisible((ImVec2 *)local_88,&bb.Min);
    if (bVar2) {
      BeginGroup();
      if (0.0 < size.x) {
        ImVec2::ImVec2(&local_a8,frame_bb.Min.x + (pIVar1->Style).ItemInnerSpacing.x,
                       (float)local_70._4_4_ + (pIVar1->Style).FramePadding.y);
        RenderText(local_a8,label,(char *)0x0,true);
      }
      local_b0 = ImRect::GetSize((ImRect *)local_70);
      BeginChildFrame(id_00,&local_b0,0);
      label_local._7_1_ = true;
    }
    else {
      local_a0 = ImRect::GetSize((ImRect *)local_88);
      ItemSize(&local_a0,(pIVar1->Style).FramePadding.y);
      ItemAdd((ImRect *)local_88,0,(ImRect *)local_70);
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::ListBoxHeader(const char* label, const ImVec2& size_arg)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetID(label);
    const ImVec2 label_size = CalcTextSize(label, NULL, true);

    // Size default to hold ~7 items. Fractional number of items helps seeing that we can scroll down/up without looking at scrollbar.
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), GetTextLineHeightWithSpacing() * 7.4f + style.ItemSpacing.y);
    ImVec2 frame_size = ImVec2(size.x, ImMax(size.y, label_size.y));
    ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + frame_size);
    ImRect bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    window->DC.LastItemRect = bb; // Forward storage for ListBoxFooter.. dodgy.
    g.NextItemData.ClearFlags();

    if (!IsRectVisible(bb.Min, bb.Max))
    {
        ItemSize(bb.GetSize(), style.FramePadding.y);
        ItemAdd(bb, 0, &frame_bb);
        return false;
    }

    BeginGroup();
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    BeginChildFrame(id, frame_bb.GetSize());
    return true;
}